

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metropolis.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  int iVar6;
  time_t tVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 local_58 [16];
  double dStack_20;
  
  iVar9 = 0;
  tVar7 = time((time_t *)0x0);
  srand((uint)tVar7);
  local_58._0_4_ = 0;
  local_58._4_4_ = 0;
  local_58._8_4_ = 0;
  local_58._12_4_ = 0;
  dVar1 = 1.0;
  iVar8 = 100;
  while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
    uVar11 = local_58._8_4_;
    uVar12 = local_58._12_4_;
    iVar6 = rand();
    dVar4 = ((double)iVar6 / 2147483647.0 + -0.5) * 0.5;
    dVar5 = (double)CONCAT44(local_58._4_4_,local_58._0_4_);
    dVar4 = dVar4 + dVar4 + dVar5;
    auVar2._8_4_ = uVar11;
    auVar2._0_8_ = dVar4;
    auVar2._12_4_ = uVar12;
    dVar5 = dVar5 * 0.5 * dVar5;
    dVar4 = dVar4 * 0.5 * dVar4;
    auVar3._8_4_ = SUB84(dVar4,0);
    auVar3._0_8_ = dVar5;
    auVar3._12_4_ = (int)((ulong)dVar4 >> 0x20);
    iVar6 = rand();
    dStack_20 = auVar3._8_8_;
    dVar4 = exp(dVar5 - dStack_20);
    if (dVar4 <= (double)iVar6 / 2147483647.0) {
      auVar2 = local_58;
    }
    local_58 = auVar2;
    iVar9 = iVar9 + (uint)((double)iVar6 / 2147483647.0 < dVar4);
    printf("%.10f\t%f\n",local_58._0_4_,SUB84((double)iVar9 / dVar1,0));
    dVar1 = dVar1 + 1.0;
  }
  return 0;
}

Assistant:

int main(void) {
    int niter = 100; // サンプルの数
    double step_size = 0.5e0;
    srand((unsigned) time(nullptr));

    double x = 0e0;
    int naccept = 0; // 受理回数カウンター

    for (int iter = 1; iter < niter + 1; iter++) {
        double backup_x = x;
        double action_init = 0.5e0 * x * x;

        double dx = (double) rand() / RAND_MAX;
        dx = (dx - 0.5e0) * step_size * 2e0;
        x += dx;

        double action_fin = 0.5e0 * x * x;

        // メトロポリステスト
        double metropolis = (double) rand() / RAND_MAX;
        if (exp(action_init - action_fin) > metropolis) {
            // 受理
            naccept++;
        } else {
            // 棄却して元に戻す
            x = backup_x;
        }
        printf("%.10f\t%f\n", x, (double) naccept / iter);
    }
}